

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O0

void __thiscall PlanningUnitMADPDiscrete::InitializeActionHistories(PlanningUnitMADPDiscrete *this)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  void *pvVar4;
  undefined4 extraout_var_00;
  value_type *pvVar5;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *__x;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *this_00;
  PlanningUnitMADPDiscrete *in_RDI;
  undefined8 extraout_XMM0_Qa;
  undefined1 auVar6 [16];
  undefined1 extraout_var_01 [56];
  undefined1 auVar7 [64];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar8 [16];
  undefined1 extraout_var_03 [56];
  undefined1 auVar9 [64];
  size_t oh_this_t;
  Index t;
  size_t nrAi;
  Index i_1;
  size_t total;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> firstAHindex_per_t;
  vector<unsigned_long,_std::allocator<unsigned_long>_> oh_per_t;
  ActionHistoryTree *treeThiAg;
  vector<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_> *temp;
  Index i;
  size_t nrAgents;
  value_type *in_stack_fffffffffffffec8;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *in_stack_fffffffffffffed0;
  value_type *in_stack_fffffffffffffed8;
  value_type *__x_00;
  MultiAgentDecisionProcessDiscreteInterface *in_stack_fffffffffffffee0;
  uint local_bc;
  uint local_ac;
  uint local_14;
  undefined1 extraout_var_02 [56];
  
  bVar2 = PlanningUnitMADPDiscreteParameters::GetComputeIndividualActionHistories
                    (&in_RDI->_m_params);
  if (bVar2) {
    iVar3 = (*(in_RDI->super_PlanningUnit)._vptr_PlanningUnit[6])();
    for (local_14 = 0; (ulong)local_14 < CONCAT44(extraout_var,iVar3); local_14 = local_14 + 1) {
      pvVar4 = operator_new(0x18);
      std::vector<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>::vector
                ((vector<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_> *)
                 0x9d11d8);
      std::
      vector<std::vector<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>,_std::allocator<std::vector<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>_>_>
      ::push_back((vector<std::vector<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>,_std::allocator<std::vector<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>_>_>
                   *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x9d1239);
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::push_back(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffee0)
      ;
      std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::vector
                ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)0x9d1292);
      std::
      vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
      ::push_back((vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                   *)in_stack_fffffffffffffed0,(value_type *)in_stack_fffffffffffffec8);
      std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::~vector
                ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
                 in_stack_fffffffffffffee0);
      if (pvVar4 != (void *)0x0) {
        std::vector<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>::~vector
                  ((vector<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_> *)
                   in_stack_fffffffffffffee0);
        operator_delete(pvVar4,0x18);
      }
      CreateActionHistoryTree
                ((PlanningUnitMADPDiscrete *)
                 oh_per_t.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 firstAHindex_per_t.
                 super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage._4_4_);
      std::vector<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_>::push_back
                ((vector<TreeNode<ActionHistory>_*,_std::allocator<TreeNode<ActionHistory>_*>_> *)
                 in_stack_fffffffffffffee0,(value_type *)in_stack_fffffffffffffed8);
    }
  }
  else {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x9d1386);
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::clear((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)0x9d1397);
    std::
    vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
    ::clear((vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
             *)0x9d13a8);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x9d13b5);
    std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::vector
              ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)0x9d13c2);
    for (local_ac = 0; iVar3 = (*(in_RDI->super_PlanningUnit)._vptr_PlanningUnit[6])(),
        (ulong)local_ac < CONCAT44(extraout_var_00,iVar3); local_ac = local_ac + 1) {
      in_stack_fffffffffffffee0 = GetMADPDI(in_RDI);
      pvVar5 = (value_type *)
               (**(code **)((long)*in_stack_fffffffffffffee0 + 0x60))
                         (in_stack_fffffffffffffee0,local_ac);
      auVar9._8_56_ = extraout_var_03;
      auVar9._0_8_ = extraout_XMM1_Qa;
      auVar7._8_56_ = extraout_var_01;
      auVar7._0_8_ = (double)extraout_XMM0_Qa;
      __x_00 = pvVar5;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x9d1454);
      std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::clear
                ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)0x9d1461);
      local_bc = 0;
      while( true ) {
        auVar8 = auVar9._0_16_;
        auVar6 = auVar7._0_16_;
        __x = (vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)(ulong)local_bc;
        this_00 = (vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
                  PlanningUnit::GetHorizon(&in_RDI->super_PlanningUnit);
        if (this_00 <= __x) break;
        std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::push_back
                  (this_00,(value_type_conflict2 *)__x);
        auVar1 = vcvtusi2sd_avx512f(auVar6,pvVar5);
        auVar6 = vcvtusi2sd_avx512f(auVar8,local_bc);
        auVar9 = ZEXT1664(auVar6);
        auVar7._0_8_ = pow(auVar1._0_8_,auVar6._0_8_);
        auVar7._8_56_ = extraout_var_02;
        vcvttsd2usi_avx512f(auVar7._0_16_);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffffee0,(value_type_conflict2 *)__x_00);
        local_bc = local_bc + 1;
      }
      std::
      vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
      ::push_back((vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                   *)in_stack_fffffffffffffee0,(value_type *)__x_00);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffee0,
                 (value_type_conflict2 *)__x_00);
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::push_back((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   *)in_stack_fffffffffffffee0,__x_00);
    }
    std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::~vector
              ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
               in_stack_fffffffffffffee0);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffee0);
  }
  return;
}

Assistant:

void PlanningUnitMADPDiscrete::InitializeActionHistories()
{
    if(_m_params.GetComputeIndividualActionHistories())
    {
        size_t nrAgents=GetNrAgents();
        for(Index i = 0; i < nrAgents; i++)
        {
            vector<ActionHistoryTree*> * temp = new 
                vector<ActionHistoryTree*>;
            _m_actionHistoryTreeVectors.push_back(* temp );
            _m_nrActionHistoriesT.push_back(vector<size_t>());
            _m_firstAHIforT.push_back(vector<LIndex>());
            delete temp; // temp is copied into the vector - so delete this imm.
            ActionHistoryTree* treeThiAg = CreateActionHistoryTree(i);
            _m_actionHistoryTreeRootPointers.push_back(treeThiAg);
        }
    }
    else
    {
        /*Calculates the number of individual action histories and
         * stores this in _m_nrActionHistories (and 
         * _m_nrActionHistoriesT).
         * Only used when the Action histories are not created.
         */
        _m_nrActionHistories.clear();
        _m_nrActionHistoriesT.clear();
        _m_firstAHIforT.clear();
        vector<size_t> oh_per_t;
        vector<LIndex> firstAHindex_per_t;
        size_t total = 0;
        for(Index i=0; i < GetNrAgents(); i++)
        {
            size_t nrAi = GetMADPDI()->GetNrActions(i);
            oh_per_t.clear();
            firstAHindex_per_t.clear();
            total = 0;
            for(Index t=0; t < GetHorizon(); t++)
            {
                firstAHindex_per_t.push_back(total);
                size_t oh_this_t = (size_t) pow( (double)nrAi, (double)t );
                oh_per_t.push_back(oh_this_t);
                total += oh_this_t;
            }
            _m_firstAHIforT.push_back(firstAHindex_per_t);
            _m_nrActionHistories.push_back(total);
            _m_nrActionHistoriesT.push_back(oh_per_t);
        }
    }
}